

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Recorder.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Recorder::ArchiveOUT(ChFunction_Recorder *this,ChArchiveOut *marchive)

{
  vector<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_> tmpvect;
  void *local_50 [2];
  long local_40;
  ChNameValue<std::vector<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Recorder>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  std::vector<chrono::ChRecPoint,std::allocator<chrono::ChRecPoint>>::
  vector<std::_List_iterator<chrono::ChRecPoint>,void>
            ((vector<chrono::ChRecPoint,std::allocator<chrono::ChRecPoint>> *)local_50,
             (this->m_points).
             super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
             _M_node.super__List_node_base._M_next,
             (_List_iterator<chrono::ChRecPoint>)&this->m_points,(allocator_type *)&local_38);
  local_38._name = "tmpvect";
  local_38._flags = '\0';
  local_38._value = (vector<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_> *)local_50;
  ChArchiveOut::out<chrono::ChRecPoint>(marchive,&local_38);
  if (local_50[0] != (void *)0x0) {
    operator_delete(local_50[0],local_40 - (long)local_50[0]);
  }
  return;
}

Assistant:

void ChFunction_Recorder::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Recorder>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data: copy to vector and store
    std::vector<ChRecPoint> tmpvect{std::begin(m_points), std::end(m_points)};
    marchive << CHNVP(tmpvect);
}